

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void NEXTH(int *BOOL,int NN,double *QHR,double *QHI,double *QPR,double *QPI,double *TR,double *TI,
          double *HR,double *HI)

{
  double dVar1;
  double dVar2;
  int local_54;
  int j;
  int NM1;
  int N;
  double T2;
  double T1;
  double *QPI_local;
  double *QPR_local;
  double *QHI_local;
  double *QHR_local;
  int NN_local;
  int *BOOL_local;
  
  if (*BOOL == 0) {
    for (local_54 = 1; local_54 < NN + -1; local_54 = local_54 + 1) {
      dVar1 = QHR[local_54 + -1];
      dVar2 = QHI[local_54 + -1];
      HR[local_54] = *TR * dVar1 + -(*TI * dVar2) + QPR[local_54];
      HI[local_54] = *TR * dVar2 + *TI * dVar1 + QPI[local_54];
    }
    *HR = *QPR;
    *HI = *QPI;
  }
  else {
    for (local_54 = 1; local_54 < NN + -1; local_54 = local_54 + 1) {
      HR[local_54] = QHR[local_54 + -1];
      HI[local_54] = QHI[local_54 + -1];
    }
    *HR = 0.0;
    *HI = 0.0;
  }
  return;
}

Assistant:

static void NEXTH(int *BOOL, int NN, double *QHR, double *QHI, double *QPR, double *QPI, double *TR, double *TI,double *HR, double *HI) {
	/*
	C CALCULATES THE NEXT SHIFTED H POLYNOMIAL.
	C BOOL   -  INT , IF 1 H(S) IS ESSENTIALLY ZERO
	*/

	double T1, T2;
	int N, NM1,j;
	N = NN - 1;
	NM1 = N - 1;

	if (*BOOL == 0) {
		for (j = 1; j < N; ++j) {
			T1 = QHR[j - 1];
			T2 = QHI[j - 1];
			HR[j] = *TR*T1 - *TI*T2 + QPR[j];
			HI[j] = *TR*T2 + *TI*T1 + QPI[j];
		}
		HR[0] = QPR[0];
		HI[0] = QPI[0];
	}
	else {
		for (j = 1; j < N; ++j) {
			HR[j] = QHR[j - 1];
			HI[j] = QHI[j - 1];
		}
		HR[0] = 0.0;
		HI[0] = 0.0;
	}
}